

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

bool __thiscall
booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<char>_>::valid_offset
          (segment_index_iterator<std::_List_iterator<char>_> *this,size_t offset)

{
  char *pcVar1;
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  *this_00;
  const_reference pvVar2;
  char *in_RSI;
  char *__s;
  segment_index_iterator<std::_List_iterator<char>_> *in_RDI;
  bool local_11;
  
  local_11 = true;
  if (in_RSI != (char *)0x0) {
    __s = in_RSI;
    pcVar1 = (char *)size((segment_index_iterator<std::_List_iterator<char>_> *)0x14b859);
    local_11 = true;
    if (in_RSI != pcVar1) {
      this_00 = (vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                 *)index(in_RDI,__s,(int)pcVar1);
      pvVar2 = std::
               vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
               ::operator[](this_00,(size_type)in_RSI);
      local_11 = (pvVar2->rule & in_RDI->mask_) != 0;
    }
  }
  return local_11;
}

Assistant:

bool valid_offset(size_t offset) const
                    {
                        return  offset == 0 
                                || offset == size() // make sure we not acess index[size]
                                || (index()[offset].rule & mask_)!=0;
                    }